

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::link_compute_shader(NegativeTestContext *ctx)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  long lVar4;
  GLint linkStatus;
  char *computeShaderSource;
  char *otherShaderSource;
  GLint local_64;
  string local_60;
  char *local_40;
  char *local_38;
  
  local_40 = "#version 320 es\nvoid main (void)\n{\n}\n";
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Compute Shader linked with shader of other kind.","");
  NegativeTestContext::beginSection(ctx,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  lVar4 = 0;
  do {
    local_64 = -1;
    GVar1 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
    GVar2 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x91b9);
    GVar3 = glu::CallLogWrapper::glCreateShader
                      (&ctx->super_CallLogWrapper,*(GLenum *)((long)&DAT_01cba830 + lVar4));
    local_38 = "#version 320 es\nlayout(max_vertices = 3) out;\nvoid main(void){}\n";
    if (lVar4 != 8) {
      local_38 = local_40;
    }
    glu::CallLogWrapper::glShaderSource(&ctx->super_CallLogWrapper,GVar2,1,&local_40,(GLint *)0x0);
    glu::CallLogWrapper::glShaderSource(&ctx->super_CallLogWrapper,GVar3,1,&local_38,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,GVar2);
    glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,GVar3);
    glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,GVar1,GVar2);
    glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,GVar1,GVar3);
    glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,GVar1);
    glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,GVar1,0x8b82,&local_64);
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,GVar3);
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,GVar2);
    glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,GVar1);
    if (local_64 != 0) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Program should not have linked","");
      NegativeTestContext::fail(ctx,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x14);
  NegativeTestContext::endSection(ctx);
  local_38 = "#version 310 es\nvoid main (void)\n{\n}\n";
  local_64 = -1;
  GVar1 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  GVar2 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x91b9);
  GVar3 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b30);
  glu::CallLogWrapper::glShaderSource(&ctx->super_CallLogWrapper,GVar2,1,&local_40,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(&ctx->super_CallLogWrapper,GVar3,1,&local_38,(GLint *)0x0);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "Compute Shader should not be linked with shaders of different version.","");
  NegativeTestContext::beginSection(ctx,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,GVar2);
  glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,GVar3);
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,GVar1,GVar2);
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,GVar1,GVar3);
  glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,GVar1);
  glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,GVar1,0x8b82,&local_64);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,GVar3);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,GVar2);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,GVar1);
  if (local_64 != 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Program should not have linked","");
    NegativeTestContext::fail(ctx,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void link_compute_shader (NegativeTestContext& ctx)
{
	const char* computeShaderSource		=	"#version 320 es\n"
											"void main (void)\n"
											"{\n"
											"}\n\0";
	{
		const GLenum shaderTypes[]			=	{
													GL_VERTEX_SHADER,
													GL_FRAGMENT_SHADER,
													GL_GEOMETRY_SHADER,
													GL_TESS_CONTROL_SHADER,
													GL_TESS_EVALUATION_SHADER
												};

		ctx.beginSection("Compute Shader linked with shader of other kind.");
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(shaderTypes); ndx++)
		{
			GLint linkStatus				=	-1;
			GLuint program					=	ctx.glCreateProgram();
			GLuint computeShader			=	ctx.glCreateShader(GL_COMPUTE_SHADER);
			GLuint otherShader				=	ctx.glCreateShader(shaderTypes[ndx]);
			const char* otherShaderSource	=	(shaderTypes[ndx] != GL_GEOMETRY_SHADER)	?
												computeShaderSource							:
												"#version 320 es\n"
												"layout(max_vertices = 3) out;\n"
												"void main(void){}\n\0";

			ctx.glShaderSource(computeShader, 1, &computeShaderSource, DE_NULL);
			ctx.glShaderSource(otherShader, 1, &otherShaderSource, DE_NULL);
			ctx.glCompileShader(computeShader);
			ctx.glCompileShader(otherShader);
			ctx.glAttachShader(program, computeShader);
			ctx.glAttachShader(program, otherShader);
			ctx.glLinkProgram(program);
			ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);
			ctx.glDeleteShader(otherShader);
			ctx.glDeleteShader(computeShader);
			ctx.glDeleteProgram(program);
			if (linkStatus != GL_FALSE)
				ctx.fail("Program should not have linked");
		}
		ctx.endSection();
	}
	{
		const char* computeShaderSource310	=	"#version 310 es\n"
												"void main (void)\n"
												"{\n"
												"}\n\0";
		GLint linkStatus					=	-1;
		GLuint program						=	ctx.glCreateProgram();
		GLuint computeShader				=	ctx.glCreateShader(GL_COMPUTE_SHADER);
		GLuint computeShader310				=	ctx.glCreateShader(GL_FRAGMENT_SHADER);

		ctx.glShaderSource(computeShader, 1, &computeShaderSource, DE_NULL);
		ctx.glShaderSource(computeShader310, 1, &computeShaderSource310, DE_NULL);
		ctx.beginSection("Compute Shader should not be linked with shaders of different version.");
		ctx.glCompileShader(computeShader);
		ctx.glCompileShader(computeShader310);
		ctx.glAttachShader(program, computeShader);
		ctx.glAttachShader(program, computeShader310);
		ctx.glLinkProgram(program);
		ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);
		ctx.glDeleteShader(computeShader310);
		ctx.glDeleteShader(computeShader);
		ctx.glDeleteProgram(program);
		if (linkStatus != GL_FALSE)
			ctx.fail("Program should not have linked");
		ctx.endSection();
	}
}